

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moptional.hpp
# Opt level: O0

MoptIterator<int,_int_*> __thiscall mopt::Moptional<int>::begin(Moptional<int> *this)

{
  bool bVar1;
  int *_underlying;
  Moptional<int> *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)this);
  if (bVar1) {
    _underlying = std::optional<int>::operator*(&this->internal_);
    MoptIterator<int,_int_*>::MoptIterator((MoptIterator<int,_int_*> *)&this_local,_underlying);
  }
  else {
    MoptIterator<int,_int_*>::MoptIterator((MoptIterator<int,_int_*> *)&this_local);
  }
  return (MoptIterator<int,_int_*>)(int *)this_local;
}

Assistant:

decltype(auto) begin() {
    if constexpr (details::IsContainerLike<T>()) {
      if (internal_) {
        return MoptIterator<T, typename details::IteratorType<T>::Type>(
            internal_->begin());
      } else {
        return MoptIterator<T, typename details::IteratorType<T>::Type>();
      }
    } else {
      if (internal_) {
        return MoptIterator<T, T*>(&*internal_);
      } else {
        return MoptIterator<T, T*>();
      }
    }
  }